

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O2

LispPTR reclaimcodeblock(LispPTR codebase)

{
  byte bVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  LispPTR *pLVar5;
  LispPTR *pLVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char local_f8 [200];
  
  if (*Closure_Cache_Enabled_word == 0) {
LAB_0011de8b:
    pLVar5 = NativeAligned4FromLAddr(codebase);
    if ((-1 < *(short *)((ulong)(pLVar5[2] >> 8 & 0xffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(pLVar5[2] & 0xfffffff,1);
    }
    if ((short)pLVar5[1] != 0) {
      pLVar5 = NativeAligned4FromLAddr(codebase);
      uVar7 = (ulong)(ushort)pLVar5[1] + (long)pLVar5;
      do {
        bVar1 = *(byte *)(uVar7 ^ 3);
        if (bVar1 == 0x6f) {
          uVar9 = (uint)*(byte *)(uVar7 + 2 ^ 3) << 0x10 | (uint)*(byte *)(uVar7 + 1 ^ 3) << 0x18;
          uVar8 = (uint)*(byte *)(uVar7 + 3 ^ 3) << 8;
          uVar10 = (uint)*(byte *)(uVar7 + 4 ^ 3) | uVar8 | uVar9;
          if (((uVar10 != codebase) &&
              (-1 < *(short *)((ulong)((uVar8 & 0xfffffe00 | uVar9) >> 8) + (long)MDStypetbl ^ 2)))
             && (*GcDisabled_word != 0x4c)) {
            rec_htfind(uVar10,1);
          }
        }
        else if (bVar1 == 0) break;
        uVar8 = oplength[(uint)bVar1];
        if (5 < uVar8) {
          sprintf(local_f8,
                  "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use UFN length"
                  ,(ulong)(uint)bVar1,uVar7 - (long)pLVar5,(ulong)(codebase >> 0x10 & 0xff),
                  (ulong)codebase & 0xffff);
          error(local_f8);
          uVar8 = (uint)(UFNTable[(ulong)bVar1 * 2] >> 8);
          oplength[bVar1] = uVar8;
        }
        uVar7 = uVar7 + uVar8 + 1;
      } while( true );
    }
    LVar4 = 0;
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(*Closure_Cache_word);
    uVar10 = codebase >> 9 & 0x7f ^ codebase * 8 & 0xffff ^ codebase >> 0x10 & 0xfff;
    LVar4 = *pLVar5;
    uVar8 = pLVar5[1] >> 0x10;
    uVar9 = uVar8 & uVar10;
    pLVar6 = NativeAligned4FromLAddr(LVar4 + uVar9 * 2);
    LVar2 = *pLVar6;
    if (LVar2 == *Deleted_Implicit_Hash_Slot_word) {
LAB_0011dd87:
      uVar11 = 0x3f;
      if (uVar8 < 0x3f) {
        uVar11 = uVar8;
      }
      do {
        do {
          uVar9 = uVar9 + (uVar11 & (uVar10 >> 8 ^ uVar10) | 1) & uVar8;
          pLVar6 = NativeAligned4FromLAddr(LVar4 + uVar9 * 2);
          LVar2 = *pLVar6;
        } while (LVar2 == *Deleted_Implicit_Hash_Slot_word);
        if (LVar2 == 0) goto LAB_0011de8b;
        pLVar6 = NativeAligned4FromLAddr(LVar2);
      } while ((*pLVar6 & 0xfffffff) != codebase);
    }
    else {
      if (LVar2 == 0) goto LAB_0011de8b;
      pLVar6 = NativeAligned4FromLAddr(LVar2);
      if ((*pLVar6 & 0xfffffff) != codebase) goto LAB_0011dd87;
    }
    if ((-1 < *(short *)((ulong)(MDStypetbl + (*Deleted_Implicit_Hash_Slot_word >> 9)) ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(*Deleted_Implicit_Hash_Slot_word,0);
    }
    pDVar3 = MDStypetbl;
    LVar4 = LVar4 + uVar9 * 2;
    pLVar6 = NativeAligned4FromLAddr(LVar4);
    if ((-1 < *(short *)((ulong)(pDVar3 + (*pLVar6 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
      pLVar6 = NativeAligned4FromLAddr(LVar4);
      rec_htfind(*pLVar6,1);
    }
    LVar2 = *Deleted_Implicit_Hash_Slot_word;
    pLVar6 = NativeAligned4FromLAddr(LVar4);
    *pLVar6 = LVar2;
    *(short *)((long)pLVar5 + 10) =
         (short)(((ulong)*(ushort *)((long)pLVar5 + 10) << 0x30) + -0x1000000000000 >> 0x30);
    LVar4 = 1;
  }
  return LVar4;
}

Assistant:

LispPTR reclaimcodeblock(LispPTR codebase) {
  struct fnhead *fnbase;
  if ((*Closure_Cache_Enabled_word != NIL) &&
      (remimplicitkeyhash(codebase, *Closure_Cache_word) != NIL)) {
    return (T);
  }
  fnbase = (struct fnhead *)NativeAligned4FromLAddr(codebase);
  REC_GCLOOKUP((POINTERMASK & fnbase->framename), DELREF);
  if (fnbase->startpc != 0) map_code_pointers(codebase, DELREF);
  return (NIL);
}